

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall
cmCTestSVN::InfoParser::InfoParser
          (InfoParser *this,cmCTestSVN *svn,char *prefix,string *rev,SVNInfo *svninfo)

{
  SVNInfo *svninfo_local;
  string *rev_local;
  char *prefix_local;
  cmCTestSVN *svn_local;
  InfoParser *this_local;
  
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__InfoParser_017d2230;
  this->Rev = rev;
  this->SVNRepo = svninfo;
  cmsys::RegularExpression::RegularExpression(&this->RegexRev);
  cmsys::RegularExpression::RegularExpression(&this->RegexURL);
  cmsys::RegularExpression::RegularExpression(&this->RegexRoot);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(svn->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexRev,"^Revision: ([0-9]+)");
  cmsys::RegularExpression::compile(&this->RegexURL,"^URL: +([^ ]+) *$");
  cmsys::RegularExpression::compile(&this->RegexRoot,"^Repository Root: +([^ ]+) *$");
  return;
}

Assistant:

InfoParser(cmCTestSVN* svn, const char* prefix, std::string& rev,
             SVNInfo& svninfo)
    : Rev(rev)
    , SVNRepo(svninfo)
  {
    this->SetLog(&svn->Log, prefix);
    this->RegexRev.compile("^Revision: ([0-9]+)");
    this->RegexURL.compile("^URL: +([^ ]+) *$");
    this->RegexRoot.compile("^Repository Root: +([^ ]+) *$");
  }